

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O3

back_insert_iterator<fmt::v6::detail::buffer<char>_>
fmt::v6::detail::write_nonfinite<char,std::back_insert_iterator<fmt::v6::detail::buffer<char>>>
          (back_insert_iterator<fmt::v6::detail::buffer<char>_> out,bool isinf,
          basic_format_specs<char> *specs,float_specs *fspecs)

{
  size_t sVar1;
  ulong uVar2;
  char *pcVar3;
  uint uVar4;
  char *pcVar5;
  buffer<char> *c;
  undefined4 uVar6;
  undefined7 in_register_00000031;
  char *pcVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  char *in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffc0;
  uint uVar11;
  char cVar12;
  
  uVar6 = (undefined4)CONCAT71(in_register_00000031,isinf);
  uVar2 = (ulong)specs->width;
  if (-1 < (long)uVar2) {
    uVar11 = *(uint *)&fspecs->field_0x4;
    uVar4 = uVar11 >> 8 & 0xff;
    uVar8 = 4 - (ulong)(uVar4 == 0);
    uVar9 = 0;
    if (uVar8 <= uVar2) {
      uVar9 = uVar2 - uVar8;
    }
    uVar2 = uVar9 >> (*(byte *)((long)&basic_data<void>::left_padding_shifts +
                               (ulong)((byte)specs->field_0x9 & 0xf)) & 0x3f);
    sVar1 = (out.container)->size_;
    uVar8 = uVar8 + sVar1 + (specs->fill).size_ * uVar9;
    if ((out.container)->capacity_ < uVar8) {
      (**(out.container)->_vptr_buffer)(out.container,uVar8);
    }
    cVar12 = (char)uVar6;
    (out.container)->size_ = uVar8;
    pcVar3 = fill<char*,char>((out.container)->ptr_ + sVar1,uVar2,&specs->fill);
    if (uVar4 != 0) {
      *pcVar3 = *(char *)((long)&basic_data<void>::signs + (ulong)uVar4);
      pcVar3 = pcVar3 + 1;
    }
    bVar10 = (uVar11 >> 0x10 & 1) == 0;
    pcVar5 = "INF";
    if (bVar10) {
      pcVar5 = "inf";
    }
    pcVar7 = "NAN";
    if (bVar10) {
      pcVar7 = "nan";
    }
    if (cVar12 != '\0') {
      pcVar7 = pcVar5;
    }
    pcVar3[2] = pcVar7[2];
    *(undefined2 *)pcVar3 = *(undefined2 *)pcVar7;
    fill<char*,char>(pcVar3 + 3,uVar9 - uVar2,&specs->fill);
    return (back_insert_iterator<fmt::v6::detail::buffer<char>_>)out.container;
  }
  assert_fail((char *)CONCAT44(uVar6,in_stack_ffffffffffffffc0),0,in_stack_ffffffffffffffb8);
}

Assistant:

OutputIt write_nonfinite(OutputIt out, bool isinf,
                         const basic_format_specs<Char>& specs,
                         const float_specs& fspecs) {
  auto str =
      isinf ? (fspecs.upper ? "INF" : "inf") : (fspecs.upper ? "NAN" : "nan");
  constexpr size_t str_size = 3;
  auto sign = fspecs.sign;
  auto size = str_size + (sign ? 1 : 0);
  using iterator = remove_reference_t<decltype(reserve(out, 0))>;
  return write_padded(out, specs, size, [=](iterator it) {
    if (sign) *it++ = static_cast<Char>(data::signs[sign]);
    return copy_str<Char>(str, str + str_size, it);
  });
}